

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

uint __thiscall Assimp::XFileParser::ReadInt(XFileParser *this)

{
  uint uVar1;
  int iVar2;
  uint local_7c;
  uint local_68;
  uint number;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  ulong uStack_28;
  bool isNegative;
  size_t len;
  XFileParser *pXStack_18;
  unsigned_short tmp;
  XFileParser *this_local;
  
  pXStack_18 = this;
  if ((this->mIsBinaryFormat & 1U) == 0) {
    FindNextNoneWhiteSpace(this);
    local_29 = *this->mP == '-';
    if ((bool)local_29) {
      this->mP = this->mP + 1;
    }
    iVar2 = isdigit((int)*this->mP);
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Number expected.",&local_51);
      ThrowException(this,&local_50);
    }
    local_68 = 0;
    while ((this->mP < this->mEnd && (iVar2 = isdigit((int)*this->mP), iVar2 != 0))) {
      local_68 = local_68 * 10 + *this->mP + -0x30;
      this->mP = this->mP + 1;
    }
    CheckForSeparator(this);
    if ((local_29 & 1) == 0) {
      local_7c = local_68;
    }
    else {
      local_7c = -local_68;
    }
    this_local._4_4_ = local_7c;
  }
  else {
    if ((this->mBinaryNumCount == 0) && (1 < (long)this->mEnd - (long)this->mP)) {
      len._6_2_ = ReadBinWord(this);
      if ((len._6_2_ == 6) && (3 < (long)this->mEnd - (long)this->mP)) {
        uVar1 = ReadBinDWord(this);
        this->mBinaryNumCount = uVar1;
      }
      else {
        this->mBinaryNumCount = 1;
      }
    }
    this->mBinaryNumCount = this->mBinaryNumCount - 1;
    uStack_28 = (long)this->mEnd - (long)this->mP;
    if (uStack_28 < 4) {
      this->mP = this->mEnd;
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = ReadBinDWord(this);
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned int XFileParser::ReadInt()
{
   if( mIsBinaryFormat)
    {
        if( mBinaryNumCount == 0 && mEnd - mP >= 2)
        {
            unsigned short tmp = ReadBinWord(); // 0x06 or 0x03
            if( tmp == 0x06 && mEnd - mP >= 4) // array of ints follows
                mBinaryNumCount = ReadBinDWord();
            else // single int follows
                mBinaryNumCount = 1;
        }

        --mBinaryNumCount;
        const size_t len( mEnd - mP );
        if ( len >= 4) {
            return ReadBinDWord();
        } else {
            mP = mEnd;
            return 0;
        }
    } else
    {
        FindNextNoneWhiteSpace();

        // TODO: consider using strtol10 instead???

        // check preceding minus sign
        bool isNegative = false;
        if( *mP == '-')
        {
            isNegative = true;
            mP++;
        }

        // at least one digit expected
        if( !isdigit( *mP))
            ThrowException( "Number expected.");

        // read digits
        unsigned int number = 0;
        while( mP < mEnd)
        {
            if( !isdigit( *mP))
                break;
            number = number * 10 + (*mP - 48);
            mP++;
        }

        CheckForSeparator();

        return isNegative ? ((unsigned int) -int( number)) : number;
    }
}